

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * __thiscall
duckdb::
GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
          (ScalarFunctionSet *__return_storage_ptr__,duckdb *this,scalar_function_t *date_func,
          scalar_function_t *ts_func,scalar_function_t *interval_func,
          function_statistics_t date_stats,function_statistics_t ts_stats)

{
  vector<duckdb::ScalarFunction,_true> *this_00;
  long lVar1;
  _Manager_type p_Var2;
  pointer pSVar3;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa3c;
  FunctionNullHandling in_stack_fffffffffffffa48;
  allocator_type local_5b1;
  bind_lambda_function_t in_stack_fffffffffffffa50;
  _Any_data local_598;
  _Manager_type local_588;
  _Invoker_type local_580;
  _Any_data local_578;
  _Manager_type local_568;
  _Invoker_type local_560;
  _Any_data local_558;
  long local_548;
  undefined8 local_540;
  LogicalType local_530;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_518;
  LogicalType local_500;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4e8;
  LogicalType local_4d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4b8;
  LogicalType local_4a0;
  LogicalType local_488;
  LogicalType local_470;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(__return_storage_ptr__);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffa50,DATE);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffa50;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_4b8,__l,&local_5b1);
  LogicalType::LogicalType(&local_4d0,BIGINT);
  local_558._M_unused._M_object = (void *)0x0;
  local_558._8_8_ = 0;
  local_548 = 0;
  local_540 = *(undefined8 *)(this + 0x18);
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 != 0) {
    local_558._M_unused._0_8_ = (undefined8)*(undefined8 *)this;
    local_558._8_8_ = *(undefined8 *)(this + 8);
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    local_548 = lVar1;
  }
  LogicalType::LogicalType(&local_470,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_470;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffa34;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffa3c;
  ScalarFunction::ScalarFunction
            (&local_208,(vector<duckdb::LogicalType,_true> *)&local_4b8,&local_4d0,
             (scalar_function_t *)&local_558,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)interval_func,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffa48,
             in_stack_fffffffffffffa50);
  this_00 = &(__return_storage_ptr__->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this_00->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
             ,&local_208);
  ScalarFunction::~ScalarFunction(&local_208);
  LogicalType::~LogicalType(&local_470);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_558);
  LogicalType::~LogicalType(&local_4d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4b8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffa50);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffa50,TIMESTAMP);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffa50;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_4e8,__l_00,&local_5b1);
  LogicalType::LogicalType(&local_500,BIGINT);
  local_578._M_unused._M_object = (void *)0x0;
  local_578._8_8_ = 0;
  local_568 = (_Manager_type)0x0;
  local_560 = date_func->_M_invoker;
  p_Var2 = (date_func->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_578._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(date_func->super__Function_base)._M_functor;
    local_578._8_8_ = *(undefined8 *)((long)&(date_func->super__Function_base)._M_functor + 8);
    (date_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    date_func->_M_invoker = (_Invoker_type)0x0;
    local_568 = p_Var2;
  }
  LogicalType::LogicalType(&local_488,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_488;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffa34;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffa3c;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_4e8,&local_500,
             (scalar_function_t *)&local_578,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,date_stats,(init_local_state_t)0x0,varargs_00,
             CONSISTENT,in_stack_fffffffffffffa48,in_stack_fffffffffffffa50);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this_00->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
             ,&local_330);
  ScalarFunction::~ScalarFunction(&local_330);
  LogicalType::~LogicalType(&local_488);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_578);
  LogicalType::~LogicalType(&local_500);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4e8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffa50);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffa50,INTERVAL);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&stack0xfffffffffffffa50;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_518,__l_01,&local_5b1);
  LogicalType::LogicalType(&local_530,BIGINT);
  local_598._M_unused._M_object = (void *)0x0;
  local_598._8_8_ = 0;
  local_588 = (_Manager_type)0x0;
  local_580 = ts_func->_M_invoker;
  p_Var2 = (ts_func->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_598._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(ts_func->super__Function_base)._M_functor;
    local_598._8_8_ = *(undefined8 *)((long)&(ts_func->super__Function_base)._M_functor + 8);
    (ts_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    ts_func->_M_invoker = (_Invoker_type)0x0;
    local_588 = p_Var2;
  }
  LogicalType::LogicalType(&local_4a0,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_4a0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffa34;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffa3c;
  ScalarFunction::ScalarFunction
            (&local_458,(vector<duckdb::LogicalType,_true> *)&local_518,&local_530,
             (scalar_function_t *)&local_598,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_01,CONSISTENT,in_stack_fffffffffffffa48,in_stack_fffffffffffffa50);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this_00->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
             ,&local_458);
  ScalarFunction::~ScalarFunction(&local_458);
  LogicalType::~LogicalType(&local_4a0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_598);
  LogicalType::~LogicalType(&local_530);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_518);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffa50);
  pSVar3 = (__return_storage_ptr__->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (__return_storage_ptr__->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar3;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

ScalarFunctionSet GetGenericDatePartFunction(scalar_function_t date_func, scalar_function_t ts_func,
                                             scalar_function_t interval_func, function_statistics_t date_stats,
                                             function_statistics_t ts_stats) {
	ScalarFunctionSet operator_set;
	operator_set.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::BIGINT, std::move(date_func), nullptr,
	                                        nullptr, date_stats, DATE_CACHE));
	operator_set.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::BIGINT, std::move(ts_func), nullptr,
	                                        nullptr, ts_stats, DATE_CACHE));
	operator_set.AddFunction(ScalarFunction({LogicalType::INTERVAL}, LogicalType::BIGINT, std::move(interval_func)));
	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return operator_set;
}